

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solverational.hpp
# Opt level: O0

void __thiscall soplex::SoPlexBase<double>::_restoreLPReal(SoPlexBase<double> *this)

{
  bool bVar1;
  type_conflict5 tVar2;
  int iVar3;
  SPxStatus SVar4;
  VarStatus *pVVar5;
  double *pdVar6;
  SPxBasisBase<double> *this_00;
  SoPlexBase<double> *in_RDI;
  VarStatus *in_stack_00000030;
  VarStatus *in_stack_00000038;
  int i;
  undefined8 in_stack_ffffffffffffffb8;
  SPxLPBase<double> *in_stack_ffffffffffffffc0;
  undefined5 in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffcd;
  undefined1 in_stack_ffffffffffffffce;
  undefined1 uVar7;
  undefined1 in_stack_ffffffffffffffcf;
  undefined1 uVar8;
  type_conflict5 tVar9;
  SPxSolverBase<double> *in_stack_ffffffffffffffd0;
  double dVar10;
  int local_c;
  
  iVar3 = intParam(in_RDI,SYNCMODE);
  if (iVar3 == 2) {
    SPxSolverBase<double>::loadLP
              (in_stack_ffffffffffffffd0,
               (SPxLPBase<double> *)
               CONCAT17(in_stack_ffffffffffffffcf,
                        CONCAT16(in_stack_ffffffffffffffce,
                                 CONCAT15(in_stack_ffffffffffffffcd,in_stack_ffffffffffffffc8))),
               SUB81((ulong)in_stack_ffffffffffffffc0 >> 0x38,0));
    if ((in_RDI->_hasBasis & 1U) != 0) {
      for (local_c = 0; iVar3 = SPxLPBase<double>::nRows((SPxLPBase<double> *)0x429a39),
          local_c < iVar3; local_c = local_c + 1) {
        pVVar5 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                           (&in_RDI->_basisStatusRows,local_c);
        if (*pVVar5 == FIXED) {
          pdVar6 = SPxLPBase<double>::lhs
                             (in_stack_ffffffffffffffc0,
                              (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
          dVar10 = *pdVar6;
          pdVar6 = SPxLPBase<double>::rhs
                             (in_stack_ffffffffffffffc0,
                              (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
          if ((dVar10 != *pdVar6) || (NAN(dVar10) || NAN(*pdVar6))) {
            tVar9 = false;
            if ((in_RDI->_hasSolRational & 1U) != 0) {
              bVar1 = SolBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                      ::isDualFeasible(&in_RDI->_solRational);
              uVar8 = false;
              tVar9 = (type_conflict5)uVar8;
              if (bVar1) {
                iVar3 = intParam(in_RDI,OBJSENSE);
                uVar7 = in_stack_ffffffffffffffce;
                if (iVar3 == 1) {
                  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                  ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                                *)in_stack_ffffffffffffffc0,
                               (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
                  tVar2 = boost::multiprecision::operator>
                                    ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                                      *)CONCAT17(uVar8,CONCAT16(in_stack_ffffffffffffffce,
                                                                CONCAT15(in_stack_ffffffffffffffcd,
                                                                         in_stack_ffffffffffffffc8))
                                                ),(int *)in_stack_ffffffffffffffc0);
                  uVar7 = true;
                  in_stack_ffffffffffffffce = uVar7;
                  tVar9 = (type_conflict5)uVar7;
                  if (tVar2) goto LAB_00429b8e;
                }
                iVar3 = intParam(in_RDI,OBJSENSE);
                in_stack_ffffffffffffffcd = false;
                in_stack_ffffffffffffffce = in_stack_ffffffffffffffcd;
                tVar9 = (type_conflict5)in_stack_ffffffffffffffcd;
                if (iVar3 == -1) {
                  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                  ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                                *)in_stack_ffffffffffffffc0,
                               (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
                  in_stack_ffffffffffffffcd =
                       boost::multiprecision::operator<
                                 ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                                   *)CONCAT17(uVar8,CONCAT16(uVar7,CONCAT15(
                                                  in_stack_ffffffffffffffcd,
                                                  in_stack_ffffffffffffffc8))),
                                  (int *)in_stack_ffffffffffffffc0);
                  in_stack_ffffffffffffffce = in_stack_ffffffffffffffcd;
                  tVar9 = (type_conflict5)in_stack_ffffffffffffffcd;
                }
              }
            }
LAB_00429b8e:
            if (tVar9 == false) {
              pVVar5 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                                 (&in_RDI->_basisStatusRows,local_c);
              *pVVar5 = ON_LOWER;
            }
            else {
              pVVar5 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                                 (&in_RDI->_basisStatusRows,local_c);
              *pVVar5 = ON_UPPER;
            }
          }
        }
      }
      DataArray<soplex::SPxSolverBase<double>::VarStatus>::get_const_ptr(&in_RDI->_basisStatusRows);
      DataArray<soplex::SPxSolverBase<double>::VarStatus>::get_const_ptr(&in_RDI->_basisStatusCols);
      SPxSolverBase<double>::setBasis
                ((SPxSolverBase<double> *)this,in_stack_00000038,in_stack_00000030);
      this_00 = SPxSolverBase<double>::basis(&in_RDI->_solver);
      SVar4 = SPxBasisBase<double>::status(this_00);
      in_RDI->_hasBasis = NO_PROBLEM < SVar4;
    }
  }
  else {
    (*(in_RDI->_realLP->super_LPRowSetBase<double>).super_SVSetBase<double>.
      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x29])
              (in_RDI->_realLP,&in_RDI->_manualLower,0);
    (*(in_RDI->_realLP->super_LPRowSetBase<double>).super_SVSetBase<double>.
      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x2c])
              (in_RDI->_realLP,&in_RDI->_manualUpper,0);
    (*(in_RDI->_realLP->super_LPRowSetBase<double>).super_SVSetBase<double>.
      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x32])
              (in_RDI->_realLP,&in_RDI->_manualLhs,0);
    (*(in_RDI->_realLP->super_LPRowSetBase<double>).super_SVSetBase<double>.
      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x35])
              (in_RDI->_realLP,&in_RDI->_manualRhs,0);
    (*(in_RDI->_realLP->super_LPRowSetBase<double>).super_SVSetBase<double>.
      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x23])
              (in_RDI->_realLP,&in_RDI->_manualObj,0);
  }
  return;
}

Assistant:

void SoPlexBase<R>::_restoreLPReal()
{
   if(intParam(SoPlexBase<R>::SYNCMODE) == SYNCMODE_MANUAL)
   {
#ifndef SOPLEX_MANUAL_ALT
      _solver.loadLP(_manualRealLP);
#else
      _realLP->changeLower(_manualLower);
      _realLP->changeUpper(_manualUpper);
      _realLP->changeLhs(_manualLhs);
      _realLP->changeRhs(_manualRhs);
      _realLP->changeObj(_manualObj);
#endif

      if(_hasBasis)
      {
         // in manual sync mode, if the right-hand side of an equality constraint is not floating-point
         // representable, the user might have constructed the constraint in the real LP by rounding down the
         // left-hand side and rounding up the right-hand side; if the basis status is fixed, we need to adjust it
         for(int i = 0; i < _solver.nRows(); i++)
         {
            if(_basisStatusRows[i] == SPxSolverBase<R>::FIXED && _solver.lhs(i) != _solver.rhs(i))
            {
               assert(_solver.rhs(i) == spxNextafter(_solver.lhs(i), R(infinity)));

               if(_hasSolRational && _solRational.isDualFeasible()
                     && ((intParam(SoPlexBase<R>::OBJSENSE) == SoPlexBase<R>::OBJSENSE_MAXIMIZE
                          && _solRational._dual[i] > 0)
                         || (intParam(SoPlexBase<R>::OBJSENSE) == SoPlexBase<R>::OBJSENSE_MINIMIZE
                             && _solRational._dual[i] < 0)))
               {
                  _basisStatusRows[i] = SPxSolverBase<R>::ON_UPPER;
               }
               else
               {
                  _basisStatusRows[i] = SPxSolverBase<R>::ON_LOWER;
               }
            }
         }

         _solver.setBasis(_basisStatusRows.get_const_ptr(), _basisStatusCols.get_const_ptr());
         _hasBasis = (_solver.basis().status() > SPxBasisBase<R>::NO_PROBLEM);
      }
   }
   else
   {
      _realLP->changeLower(_manualLower);
      _realLP->changeUpper(_manualUpper);
      _realLP->changeLhs(_manualLhs);
      _realLP->changeRhs(_manualRhs);
      _realLP->changeObj(_manualObj);
   }
}